

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtrclient.c
# Opt level: O0

_Bool is_valid_port_number(char *str)

{
  long lVar1;
  _Bool _Var2;
  int iVar3;
  long in_FS_OFFSET;
  int port;
  char *str_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _Var2 = is_numeric(str);
  if (_Var2) {
    iVar3 = atoi(str);
    if ((iVar3 < 1) || (0xffff < iVar3)) {
      str_local._7_1_ = false;
    }
    else {
      str_local._7_1_ = true;
    }
  }
  else {
    str_local._7_1_ = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return str_local._7_1_;
  }
  __stack_chk_fail();
}

Assistant:

static bool is_valid_port_number(const char *str)
{
	if (!is_numeric(str))
		return false;

	int port = atoi(str);

	if (port < 1 || port > 65535)
		return false;

	return true;
}